

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

string * CLI::ignore_case(string *__return_storage_ptr__,string *item)

{
  pointer pcVar1;
  size_type *local_38;
  size_type local_30;
  size_type local_28;
  undefined8 uStack_20;
  
  pcVar1 = (item->_M_dataplus)._M_p;
  local_38 = &local_28;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + item->_M_string_length);
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
            (local_38,local_30 + (long)local_38,local_38);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_38 == &local_28) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_28;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_20;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_28;
  }
  __return_storage_ptr__->_M_string_length = local_30;
  return __return_storage_ptr__;
}

Assistant:

inline std::string ignore_case(std::string item) { return detail::to_lower(item); }